

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_file.c
# Opt level: O0

lu_int lu_file_compress(lu_int nlines,lu_int *begin,lu_int *end,lu_int *next,lu_int *index,
                       double *value,double stretch,lu_int pad)

{
  int iVar1;
  int iVar2;
  lu_int nz;
  lu_int extra_space;
  lu_int used;
  lu_int iend;
  lu_int ibeg;
  lu_int pos;
  lu_int i;
  double stretch_local;
  double *value_local;
  lu_int *index_local;
  lu_int *next_local;
  lu_int *end_local;
  lu_int *begin_local;
  lu_int nlines_local;
  
  nz = 0;
  used = 0;
  extra_space = 0;
  for (i = next[nlines]; i < nlines; i = next[i]) {
    iVar1 = begin[i];
    iVar2 = end[i];
    used = extra_space + used;
    if (iVar1 < used) {
      used = iVar1;
    }
    begin[i] = used;
    for (pos = iVar1; pos < iVar2; pos = pos + 1) {
      index[used] = index[pos];
      value[used] = value[pos];
      used = used + 1;
    }
    end[i] = used;
    extra_space = (lu_int)(stretch * (double)(iVar2 - iVar1) + (double)pad);
    nz = (iVar2 - iVar1) + nz;
  }
  used = extra_space + used;
  if (begin[nlines] < used) {
    used = begin[nlines];
  }
  begin[nlines] = used;
  return nz;
}

Assistant:

lu_int lu_file_compress(
    lu_int nlines, lu_int *begin, lu_int *end, const lu_int *next,
    lu_int *index, double *value, double stretch, lu_int pad)
{
    lu_int i, pos, ibeg, iend, used, extra_space, nz = 0;

    used = 0; extra_space = 0;
    for (i = next[nlines]; i < nlines; i = next[i]) /* move line i */
    {
        ibeg = begin[i];
        iend = end[i];
        assert(ibeg >= used);
        used += extra_space;
        if (used > ibeg)
            used = ibeg;        /* chop extra space added before */
        begin[i] = used;
        for (pos = ibeg; pos < iend; pos++)
        {
            index[used] = index[pos];
            value[used++] = value[pos];
        }
        end[i] = used;
        extra_space = stretch*(iend-ibeg) + pad;
        nz += iend-ibeg;
    }
    assert(used <= begin[nlines]);
    used += extra_space;
    if (used > begin[nlines])
        used = begin[nlines];   /* never use more space than before */
    begin[nlines] = used;
    return nz;
}